

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

void lzx_decode_free(lzx_stream *strm)

{
  lzx_stream *strm_local;
  
  if (strm->ds != (lzx_dec *)0x0) {
    free(strm->ds->w_buff);
    free(strm->ds->pos_tbl);
    lzx_huffman_free(&strm->ds->at);
    lzx_huffman_free(&strm->ds->pt);
    lzx_huffman_free(&strm->ds->mt);
    lzx_huffman_free(&strm->ds->lt);
    free(strm->ds);
    strm->ds = (lzx_dec *)0x0;
  }
  return;
}

Assistant:

static void
lzx_decode_free(struct lzx_stream *strm)
{

	if (strm->ds == NULL)
		return;
	free(strm->ds->w_buff);
	free(strm->ds->pos_tbl);
	lzx_huffman_free(&(strm->ds->at));
	lzx_huffman_free(&(strm->ds->pt));
	lzx_huffman_free(&(strm->ds->mt));
	lzx_huffman_free(&(strm->ds->lt));
	free(strm->ds);
	strm->ds = NULL;
}